

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O0

void cuddPrintVarGroups(DdManager *dd,MtrNode *root,int zdd,int silent)

{
  uint local_2c;
  MtrNode *pMStack_28;
  int level;
  MtrNode *node;
  int silent_local;
  int zdd_local;
  MtrNode *root_local;
  DdManager *dd_local;
  
  if (root == (MtrNode *)0x0) {
    __assert_fail("root != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x2f4,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  if ((root->younger != (MtrNode *)0x0) && (root->younger->elder != root)) {
    __assert_fail("root->younger == NULL || root->younger->elder == root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x2f5,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  if ((root->elder != (MtrNode *)0x0) && (root->elder->younger != root)) {
    __assert_fail("root->elder == NULL || root->elder->younger == root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x2f6,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  if (zdd == 0) {
    local_2c = dd->perm[root->index];
  }
  else {
    local_2c = dd->permZ[root->index];
  }
  if (silent == 0) {
    printf("(%d",(ulong)local_2c);
  }
  if (((root->flags & 1) == 0) && (root->child != (MtrNode *)0x0)) {
    for (pMStack_28 = root->child; pMStack_28 != (MtrNode *)0x0; pMStack_28 = pMStack_28->younger) {
      if ((pMStack_28->low < root->low) ||
         ((int)(root->low + root->size) < (int)(pMStack_28->low + pMStack_28->size))) {
        __assert_fail("node->low >= root->low && (int) (node->low + node->size) <= (int) (root->low + root->size)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                      ,0x302,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
      }
      if (pMStack_28->parent != root) {
        __assert_fail("node->parent == root",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                      ,0x303,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
      }
      cuddPrintVarGroups(dd,pMStack_28,zdd,silent);
    }
  }
  else if (silent == 0) {
    printf(",");
  }
  if (silent == 0) {
    printf("%d",(ulong)((local_2c + root->size) - 1));
    if (root->flags != 0) {
      printf("|");
      if ((root->flags & 4) != 0) {
        printf("F");
      }
      if ((root->flags & 8) != 0) {
        printf("N");
      }
      if ((root->flags & 2) != 0) {
        printf("S");
      }
    }
    printf(")");
    if (root->parent == (MtrNode *)0x0) {
      printf("\n");
    }
  }
  if ((root->flags & 0xfffffff0) != 0) {
    __assert_fail("(root->flags &~(MTR_TERMINAL | MTR_SOFT | MTR_FIXED | MTR_NEWNODE)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddCheck.c"
                  ,0x313,"void cuddPrintVarGroups(DdManager *, MtrNode *, int, int)");
  }
  return;
}

Assistant:

void
cuddPrintVarGroups(
  DdManager * dd /* manager */,
  MtrNode * root /* root of the group tree */,
  int zdd /* 0: BDD; 1: ZDD */,
  int silent /* flag to check tree syntax only */)
{
    MtrNode *node;
    int level;

    assert(root != NULL);
    assert(root->younger == NULL || root->younger->elder == root);
    assert(root->elder == NULL || root->elder->younger == root);
    if (zdd) {
        level = dd->permZ[root->index];
    } else {
        level = dd->perm[root->index];
    }
    if (!silent) (void) printf("(%d",level);
    if (MTR_TEST(root,MTR_TERMINAL) || root->child == NULL) {
        if (!silent) (void) printf(",");
    } else {
        node = root->child;
        while (node != NULL) {
            assert(node->low >= root->low && (int) (node->low + node->size) <= (int) (root->low + root->size));
            assert(node->parent == root);
            cuddPrintVarGroups(dd,node,zdd,silent);
            node = node->younger;
        }
    }
    if (!silent) {
        (void) printf("%d", (int) (level + root->size - 1));
        if (root->flags != MTR_DEFAULT) {
            (void) printf("|");
            if (MTR_TEST(root,MTR_FIXED)) (void) printf("F");
            if (MTR_TEST(root,MTR_NEWNODE)) (void) printf("N");
            if (MTR_TEST(root,MTR_SOFT)) (void) printf("S");
        }
        (void) printf(")");
        if (root->parent == NULL) (void) printf("\n");
    }
    assert((root->flags &~(MTR_TERMINAL | MTR_SOFT | MTR_FIXED | MTR_NEWNODE)) == 0);
    return;

}